

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

int resist(monst *mtmp,char oclass,int damage,int domsg)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint local_34;
  uint local_28;
  int local_24;
  int dlev;
  int alev;
  int resisted;
  int domsg_local;
  int damage_local;
  char oclass_local;
  monst *mtmp_local;
  
  switch(oclass) {
  case '\x02':
    local_24 = 10;
    break;
  default:
    local_24 = u.ulevel;
    break;
  case '\x04':
    local_24 = 5;
    break;
  case '\x06':
    local_24 = 10;
    break;
  case '\b':
    local_24 = 6;
    break;
  case '\t':
    local_24 = 9;
    break;
  case '\v':
    local_24 = 0xc;
  }
  local_28 = (uint)mtmp->m_lev;
  if (local_28 < 0x33) {
    if (local_28 == 0) {
      if ((mtmp->data < mons + 0x159) || (mons + 0x168 < mtmp->data)) {
        local_34 = 1;
      }
      else {
        local_34 = u.ulevel;
      }
      local_28 = local_34;
    }
  }
  else {
    local_28 = 0x32;
  }
  iVar1 = rn2((local_24 + 100) - local_28);
  uVar2 = (uint)(iVar1 < mtmp->data->mr);
  resisted = damage;
  if (uVar2 != 0) {
    if (domsg != 0) {
      shieldeff(mtmp->mx,mtmp->my);
      pcVar3 = Monnam(mtmp);
      pline("%s resists!",pcVar3);
    }
    resisted = (damage + 1) / 2;
  }
  if ((resisted != 0) && (mtmp->mhp = mtmp->mhp - resisted, mtmp->mhp < 1)) {
    if (m_using == '\0') {
      killed(mtmp);
    }
    else {
      monkilled(mtmp,"",0xf2);
    }
  }
  return uVar2;
}

Assistant:

int resist(struct monst *mtmp, char oclass, int damage, int domsg)
{
	int resisted;
	int alev, dlev;

	/* attack level */
	switch (oclass) {
	    case WAND_CLASS:	alev = 12;	 break;
	    case TOOL_CLASS:	alev = 10;	 break;	/* instrument */
	    case WEAPON_CLASS:	alev = 10;	 break;	/* artifact */
	    case SCROLL_CLASS:	alev =  9;	 break;
	    case POTION_CLASS:	alev =  6;	 break;
	    case RING_CLASS:	alev =  5;	 break;
	    default:		alev = u.ulevel; break;	/* spell */
	}
	/* defense level */
	dlev = (int)mtmp->m_lev;
	if (dlev > 50) dlev = 50;
	else if (dlev < 1) dlev = is_mplayer(mtmp->data) ? u.ulevel : 1;

	resisted = rn2(100 + alev - dlev) < mtmp->data->mr;
	if (resisted) {
	    if (domsg) {
		shieldeff(mtmp->mx, mtmp->my);
		pline("%s resists!", Monnam(mtmp));
	    }
	    damage = (damage + 1) / 2;
	}

	if (damage) {
	    mtmp->mhp -= damage;
	    if (mtmp->mhp < 1) {
		if (m_using) monkilled(mtmp, "", AD_RBRE);
		else killed(mtmp);
	    }
	}
	return resisted;
}